

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::LoadCache(cmake *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  string cacheFile;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
  bVar1 = LoadCache(this,psVar3);
  if (!bVar1) {
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    local_70.View_._M_str = (psVar3->_M_dataplus)._M_p;
    local_70.View_._M_len = psVar3->_M_string_length;
    local_40.View_._M_len = 0xf;
    local_40.View_._M_str = "/CMakeCache.txt";
    cmStrCat<>(&cacheFile,&local_70,&local_40);
    bVar1 = cmsys::SystemTools::FileExists(&cacheFile);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "There is a CMakeCache.txt file for the current binary tree but cmake does not have permission to read it. Please check the permissions of the directory you are trying to run CMake on."
                 ,(allocator<char> *)&local_40);
      cmSystemTools::Error((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&cacheFile);
      return -1;
    }
    std::__cxx11::string::~string((string *)&cacheFile);
  }
  iVar2 = AddCMakePaths(this);
  return iVar2 * 3 + -3;
}

Assistant:

int cmake::LoadCache()
{
  // could we not read the cache
  if (!this->LoadCache(this->GetHomeOutputDirectory())) {
    // if it does exist, but isn't readable then warn the user
    std::string cacheFile =
      cmStrCat(this->GetHomeOutputDirectory(), "/CMakeCache.txt");
    if (cmSystemTools::FileExists(cacheFile)) {
      cmSystemTools::Error(
        "There is a CMakeCache.txt file for the current binary tree but "
        "cmake does not have permission to read it. Please check the "
        "permissions of the directory you are trying to run CMake on.");
      return -1;
    }
  }

  // setup CMAKE_ROOT and CMAKE_COMMAND
  if (!this->AddCMakePaths()) {
    return -3;
  }
  return 0;
}